

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::IfExpr::~IfExpr(IfExpr *this)

{
  IfExpr *this_local;
  
  (this->super_ExprMixin<(wabt::ExprType)19>).super_Expr._vptr_Expr =
       (_func_int **)&PTR__IfExpr_01e54128;
  intrusive_list<wabt::Expr>::~intrusive_list(&this->false_);
  Block::~Block(&this->true_);
  ExprMixin<(wabt::ExprType)19>::~ExprMixin(&this->super_ExprMixin<(wabt::ExprType)19>);
  return;
}

Assistant:

explicit IfExpr(const Location& loc = Location())
      : ExprMixin<ExprType::If>(loc) {}